

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotest.c
# Opt level: O0

int test_is_at(int index,...)

{
  int in_EDI;
  size_t level;
  va_list arg;
  bool local_101;
  int *local_100;
  int local_e8 [46];
  long local_30;
  uint local_28;
  int *local_20;
  int local_4;
  
  local_20 = (int *)&stack0x00000008;
  local_28 = 8;
  local_30 = 0;
  local_4 = in_EDI;
  while (local_4 == test_index[local_30] && local_4 != 0) {
    if (local_28 < 0x29) {
      local_100 = (int *)((long)local_e8 + (long)(int)local_28);
      local_28 = local_28 + 8;
    }
    else {
      local_100 = local_20;
      local_20 = local_20 + 2;
    }
    local_30 = local_30 + 1;
    local_4 = *local_100;
  }
  local_101 = local_4 == test_index[local_30] && local_4 == 0;
  return (uint)local_101;
}

Assistant:

int test_is_at(int index, ...)
{
    va_list arg;
    va_start(arg, index);
    size_t level;

    for (level = 0; index == test_index[level] && index != 0; ++level)
        index = va_arg(arg, int);

    va_end(arg);
    return index == test_index[level] && index == 0;
}